

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * __thiscall
libtorrent::aux::print_listen_interfaces_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,
          vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
          *in)

{
  uint uVar1;
  ulong *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  char *__s;
  byte *pbVar9;
  byte *__src;
  char cVar10;
  size_t __n;
  ulong *puVar11;
  bytes_type bytes;
  array<char,_22UL> ret;
  char local_88;
  byte local_87;
  char local_78 [19];
  byte local_65 [53];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar11 = *(ulong **)this;
  puVar2 = *(ulong **)(this + 8);
  do {
    if (puVar11 == puVar2) {
      return __return_storage_ptr__;
    }
    cVar10 = (char)__return_storage_ptr__;
    if (__return_storage_ptr__->_M_string_length != 0) {
      ::std::__cxx11::string::push_back(cVar10);
    }
    __s = (char *)*puVar11;
    piVar6 = __errno_location();
    *piVar6 = 0;
    pcVar7 = strchr(__s,0x25);
    if (pcVar7 == (char *)0x0) {
LAB_00307899:
      iVar5 = inet_pton(10,__s,&local_88);
      if (iVar5 < 1) goto LAB_003078ec;
      iVar5 = *piVar6;
      if ((((pcVar7 != (char *)0x0) && (local_88 != -2)) && (local_88 == -1)) &&
         ((local_87 & 0xf) == 2)) {
        if_nametoindex(pcVar7 + 1);
      }
      if (iVar5 != 0) goto LAB_003078ec;
      ::std::__cxx11::string::push_back(cVar10);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar11);
      ::std::__cxx11::string::push_back(cVar10);
    }
    else {
      __n = (long)pcVar7 - (long)__s;
      if ((long)__n < 0x40) {
        memcpy(local_78,__s,__n);
        local_78[__n] = '\0';
        __s = local_78;
        goto LAB_00307899;
      }
LAB_003078ec:
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar11);
    }
    ::std::__cxx11::string::push_back(cVar10);
    uVar1 = (uint)puVar11[4];
    local_65[2] = 0;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar8 = (ulong)uVar4;
    pbVar9 = local_65 + 1;
    do {
      __src = pbVar9;
      *__src = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
      pbVar9 = __src + -1;
      bVar3 = 9 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar3);
    if ((int)uVar1 < 0) {
      *pbVar9 = 0x2d;
      __src = pbVar9;
    }
    memmove(local_78,__src,(size_t)(local_65 + (3 - (long)__src)));
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (*(char *)((long)puVar11 + 0x24) == '\x01') {
      ::std::__cxx11::string::push_back(cVar10);
    }
    if (*(char *)((long)puVar11 + 0x25) == '\x01') {
      ::std::__cxx11::string::push_back(cVar10);
    }
    puVar11 = puVar11 + 5;
  } while( true );
}

Assistant:

std::string print_listen_interfaces(std::vector<listen_interface_t> const& in)
	{
		std::string ret;
		for (auto const& i : in)
		{
			if (!ret.empty()) ret += ',';

			error_code ec;
			make_address_v6(i.device, ec);
			if (!ec)
			{
				// IPv6 addresses must be wrapped in square brackets
				ret += '[';
				ret += i.device;
				ret += ']';
			}
			else
			{
				ret += i.device;
			}
			ret += ':';
			ret += to_string(i.port).data();
			if (i.ssl) ret += 's';
			if (i.local) ret += 'l';
		}

		return ret;
	}